

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_set_sensor_register(katherine_device_t *device,char reg_idx,int32_t reg_value)

{
  int iVar1;
  char local_2c [4];
  char local_28;
  undefined1 local_26;
  char cmd [8];
  int res;
  int32_t reg_value_local;
  char reg_idx_local;
  katherine_device_t *device_local;
  
  cmd._4_4_ = reg_value;
  cmd._0_4_ = katherine_udp_mutex_lock(&device->control_socket);
  if (cmd._0_4_ == 0) {
    memset(local_2c,0,8);
    local_26 = 8;
    local_28 = reg_idx;
    katherine_cmd_long(local_2c,(long)(int)cmd._4_4_);
    cmd._0_4_ = katherine_cmd(&device->control_socket,local_2c,8);
    if ((cmd._0_4_ == 0) &&
       (cmd._0_4_ = katherine_cmd_wait_ack(&device->control_socket), cmd._0_4_ == 0)) {
      katherine_udp_mutex_unlock(&device->control_socket);
      return 0;
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  iVar1._0_1_ = cmd[0];
  iVar1._1_1_ = cmd[1];
  iVar1._2_1_ = cmd[2];
  iVar1._3_1_ = cmd[3];
  return iVar1;
}

Assistant:

int
katherine_set_sensor_register(katherine_device_t *device, char reg_idx, int32_t reg_value)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    char cmd[8] = {0};
    cmd[6] = CMD_TYPE_SENSOR_REGISTER_SETTING;
    cmd[4] = reg_idx;
    katherine_cmd_long(cmd, reg_value);

    res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}